

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void wr_misc(void)

{
  int local_14;
  ulong uStack_10;
  wchar_t j;
  size_t i;
  
  wr_string(world->name);
  for (local_14 = 0; local_14 < world->num_levels; local_14 = local_14 + 1) {
    wr_byte((world->levels[local_14].visited & 1U) != 0);
  }
  wr_u32b(seed_randart);
  wr_u32b(seed_flavor);
  wr_u16b(player->total_winner);
  wr_u16b(player->noscore);
  wr_byte(player->is_dead & 1);
  wr_s32b(turn);
  for (uStack_10 = 0; uStack_10 < 6; uStack_10 = uStack_10 + 1) {
    wr_byte(player->obj_k->flags[uStack_10]);
  }
  for (uStack_10 = 0; uStack_10 < 0x11; uStack_10 = uStack_10 + 1) {
    wr_s16b(player->obj_k->modifiers[uStack_10]);
  }
  for (uStack_10 = 0; uStack_10 < 0x1c; uStack_10 = uStack_10 + 1) {
    wr_s16b(player->obj_k->el_info[uStack_10].res_level);
    wr_byte(player->obj_k->el_info[uStack_10].flags);
  }
  for (uStack_10 = 0; uStack_10 < z_info->brand_max; uStack_10 = uStack_10 + 1) {
    wr_byte((player->obj_k->brands[uStack_10] & 1U) != 0);
  }
  for (uStack_10 = 0; uStack_10 < z_info->slay_max; uStack_10 = uStack_10 + 1) {
    wr_byte((player->obj_k->slays[uStack_10] & 1U) != 0);
  }
  for (uStack_10 = 0; uStack_10 < z_info->curse_max; uStack_10 = uStack_10 + 1) {
    wr_byte(player->obj_k->curses[uStack_10].power != L'\0');
  }
  wr_s16b(player->obj_k->ac);
  wr_s16b(player->obj_k->to_a);
  wr_s16b(player->obj_k->to_h);
  wr_s16b(player->obj_k->to_d);
  wr_byte(player->obj_k->dd);
  wr_byte(player->obj_k->ds);
  return;
}

Assistant:

void wr_misc(void)
{
	size_t i;
	int j;

	/* Map */
	wr_string(world->name);

	/* Where we've been */
	for (j = 0; j < world->num_levels; j++) {
		wr_byte(world->levels[j].visited ? 1 : 0);
	}

	/* Random artifact seed */
	wr_u32b(seed_randart);

	/* Write the "object seeds" */
	wr_u32b(seed_flavor);

	/* Special stuff */
	wr_u16b(player->total_winner);
	wr_u16b(player->noscore);

	/* Write death */
	wr_byte(player->is_dead);

	/* Current turn */
	wr_s32b(turn);

	/* Property knowledge */
	/* Flags */
	for (i = 0; i < OF_SIZE; i++)
		wr_byte(player->obj_k->flags[i]);

	/* Modifiers */
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		wr_s16b(player->obj_k->modifiers[i]);
	}

	/* Elements */
	for (i = 0; i < ELEM_MAX; i++) {
		wr_s16b(player->obj_k->el_info[i].res_level);
		wr_byte(player->obj_k->el_info[i].flags);
	}

	/* Brands */
	for (i = 0; i < z_info->brand_max; i++) {
		wr_byte(player->obj_k->brands[i] ? 1 : 0);
	}

	/* Slays */
	for (i = 0; i < z_info->slay_max; i++) {
		wr_byte(player->obj_k->slays[i] ? 1 : 0);
	}

	/* Curses */
	for (i = 0; i < z_info->curse_max; i++) {
		wr_byte(player->obj_k->curses[i].power ? 1 : 0);
	}

	/* Combat data */
	wr_s16b(player->obj_k->ac);
	wr_s16b(player->obj_k->to_a);
	wr_s16b(player->obj_k->to_h);
	wr_s16b(player->obj_k->to_d);
	wr_byte(player->obj_k->dd);
	wr_byte(player->obj_k->ds);
}